

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  lyd_node *plVar3;
  undefined8 *local_98;
  long *local_80;
  long *local_68;
  char *local_50;
  char *yang_data_name;
  lyd_node *iter;
  lyd_node *data_tree;
  lyd_node *rpc_act;
  __va_list_tag *ap_local;
  int options_local;
  LYD_FORMAT format_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  data_tree = (lyd_node *)0x0;
  iter = (lyd_node *)0x0;
  local_50 = (char *)0x0;
  iVar2 = lyp_data_check_options(ctx,options,"lyd_parse_data_");
  if (iVar2 != 0) {
    return (lyd_node *)0x0;
  }
  if ((options & 0x20U) != 0) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_68 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_68 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_68 + 1;
    }
    data_tree = (lyd_node *)*local_68;
    if (((data_tree == (lyd_node *)0x0) || (data_tree->parent != (lyd_node *)0x0)) ||
       ((data_tree->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_data_");
      return (lyd_node *)0x0;
    }
  }
  if ((options & 0x70U) != 0) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_80 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_80 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_80 + 1;
    }
    iter = (lyd_node *)*local_80;
    if (iter != (lyd_node *)0x0) {
      yang_data_name = (char *)iter;
      if ((options & 0x8000U) != 0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
               ,"lyd_parse_data_");
        return (lyd_node *)0x0;
      }
      for (; yang_data_name != (char *)0x0; yang_data_name = *(char **)(yang_data_name + 0x18)) {
        if (*(long *)(yang_data_name + 0x28) != 0) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (const struct lyd_node *data_tree).",
                 "lyd_parse_data_");
          return (lyd_node *)0x0;
        }
      }
      while (iter->prev->next != (lyd_node *)0x0) {
        iter = iter->prev;
      }
      if ((options & 0x1000U) != 0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
               ,"lyd_parse_data_");
        return (lyd_node *)0x0;
      }
    }
  }
  if ((options & 0x1000000U) != 0) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_98 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_98 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_98 + 1;
    }
    local_50 = (char *)*local_98;
  }
  plVar3 = lyd_parse_(ctx,data_tree,data,format,options,iter,local_50);
  return plVar3;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;
    const char *yang_data_name = NULL;

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                return NULL;
            }

            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree, yang_data_name);
}